

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueueWriter.hpp
# Opt level: O0

void __thiscall binlog::detail::QueueWriter::endWrite(QueueWriter *this)

{
  char *pcVar1;
  Queue *pQVar2;
  char *pcVar3;
  QueueWriter *in_RDI;
  size_t newW;
  memory_order __b;
  
  pcVar1 = in_RDI->_writePos;
  pcVar3 = buffer(in_RDI);
  pQVar2 = in_RDI->_queue;
  std::operator&(memory_order_release,__memory_order_mask);
  (pQVar2->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar1 - (long)pcVar3;
  return;
}

Assistant:

void endWrite()
  {
    const std::size_t newW = std::size_t(_writePos - buffer());
    _queue->writeIndex.store(newW, std::memory_order_release);
  }